

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

int lys_set_enabled(lys_module *module)

{
  uint16_t *puVar1;
  lys_module **pplVar2;
  lys_node **pplVar3;
  ly_ctx *plVar4;
  lys_module *node;
  lys_node *plVar5;
  long lVar6;
  int iVar7;
  LYS_NODE LVar8;
  LY_ERR *pLVar9;
  ly_set *mods;
  ly_set *set;
  ly_set *set_00;
  lys_node *plVar10;
  lys_node *plVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  lys_ident *der;
  ulong uVar15;
  long lVar16;
  lys_node *leafref;
  ulong uVar17;
  lys_node *node_00;
  bool bVar18;
  uint local_34 [2];
  uint s;
  
  if (module == (lys_module *)0x0) {
    pLVar9 = ly_errno_location();
    *pLVar9 = LY_EINVAL;
  }
  else {
    if ((module->field_0x40 & 0x40) == 0) {
      return 0;
    }
    plVar4 = module->ctx;
    lVar16 = 0;
    do {
      if (lVar16 == 5) {
        mods = ly_set_new();
        set = ly_set_new();
        lys_set_enabled_(mods,module);
        lVar16 = 5;
LAB_0011029d:
        do {
          if ((plVar4->models).used <= lVar16) {
            uVar12 = 0;
            do {
              uVar17 = (ulong)mods->number;
              if (uVar17 <= uVar12) {
                for (uVar12 = 0; uVar12 < uVar17; uVar12 = uVar12 + 1) {
                  lys_sub_module_apply_devs_augs((lys_module *)(mods->set).s[uVar12]);
                  uVar17 = (ulong)mods->number;
                }
                ly_set_free(mods);
                ly_set_free(set);
                puVar1 = &(plVar4->models).module_set_id;
                *puVar1 = *puVar1 + 1;
                return 0;
              }
              plVar5 = (mods->set).s[uVar12];
              for (uVar17 = 0; uVar17 < *(ushort *)((long)&plVar5->parent + 4); uVar17 = uVar17 + 1)
              {
                for (uVar15 = 0; uVar15 < (byte)plVar5[1].dsc[uVar17 * 0x48 + 0x1f];
                    uVar15 = uVar15 + 1) {
                  der = (lys_ident *)(plVar5[1].dsc + uVar17 * 0x48);
                  resolve_identity_backlink_update(der,der->base[uVar15]);
                }
              }
              for (uVar17 = 0; uVar17 < *(byte *)((long)&plVar5->parent + 7); uVar17 = uVar17 + 1) {
                lVar16 = uVar17 * 0x40;
                for (uVar15 = 0; uVar15 < (byte)plVar5[1].ref[lVar16 + 0x1b]; uVar15 = uVar15 + 1) {
                  resolve_iffeature_getsizes
                            ((lys_iffeature *)
                             (*(long *)(plVar5[1].ref + lVar16 + 0x28) + uVar15 * 0x20),(uint *)0x0,
                             local_34);
                  while (bVar18 = local_34[0] != 0, local_34[0] = local_34[0] - 1, bVar18) {
                    pcVar14 = plVar5[1].ref;
                    lVar13 = *(long *)(*(long *)(*(long *)(pcVar14 + lVar16 + 0x28) + 0x10 +
                                                uVar15 * 0x20) + (ulong)local_34[0] * 8);
                    set_00 = *(ly_set **)(lVar13 + 0x38);
                    if (set_00 == (ly_set *)0x0) {
                      set_00 = ly_set_new();
                      *(ly_set **)(lVar13 + 0x38) = set_00;
                      pcVar14 = plVar5[1].ref;
                    }
                    ly_set_add(set_00,pcVar14 + lVar16,1);
                  }
                }
              }
              leafref = *(lys_node **)&plVar5[1].nodetype;
LAB_00110468:
              if (leafref != (lys_node *)0x0) {
                LVar8 = leafref->nodetype;
                if (((LVar8 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
                   (iVar7._0_2_ = leafref[1].flags, iVar7._2_1_ = leafref[1].ext_size,
                   iVar7._3_1_ = leafref[1].iffeature_size, iVar7 == 9)) {
                  lys_leaf_add_leafref_target((lys_node_leaf *)leafref[1].parent,leafref);
                  LVar8 = leafref->nodetype;
                }
                node_00 = leafref;
                plVar10 = leafref->child;
                if (leafref->child != (lys_node *)0x0 &&
                    (LVar8 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) goto LAB_001104c5;
                if (leafref == *(lys_node **)&plVar5[1].nodetype) goto LAB_00110505;
                do {
                  plVar10 = node_00->next;
LAB_001104c5:
                  leafref = plVar10;
                  if (leafref != (lys_node *)0x0) break;
                  node_00 = node_00->parent;
                  if (node_00->nodetype == LYS_AUGMENT) {
                    node_00 = node_00->prev;
                  }
                  plVar10 = lys_parent(node_00);
                  plVar11 = lys_parent(*(lys_node **)&plVar5[1].nodetype);
                } while (plVar10 != plVar11);
                goto LAB_00110468;
              }
LAB_00110505:
              uVar12 = uVar12 + 1;
            } while( true );
          }
          node = (plVar4->models).list[lVar16];
          if (((node->field_0x40 & 0x40) != 0) && (iVar7 = ly_set_contains(set,node), iVar7 == -1))
          {
            lVar13 = 0;
LAB_001102e1:
            if ((ulong)node->imp_size * 0x38 + 0x38 != lVar13 + 0x38) goto code_r0x001102ea;
            for (uVar12 = 0; uVar12 != node->imp_size; uVar12 = uVar12 + 1) {
              uVar17 = 0;
              while (mods->number != uVar17) {
                pplVar3 = (mods->set).s + uVar17;
                uVar17 = uVar17 + 1;
                if (node->imp[uVar12].module == (lys_module *)*pplVar3) {
                  node->field_0x40 = node->field_0x40 & 0xbf;
                  ly_set_add(mods,node,0);
                  lVar16 = 5;
                  goto LAB_0011029d;
                }
              }
            }
            ly_set_add(set,node,0);
          }
LAB_001102fb:
          lVar16 = lVar16 + 1;
        } while( true );
      }
      pplVar2 = (plVar4->models).list + lVar16;
      lVar16 = lVar16 + 1;
    } while (*pplVar2 != module);
    pLVar9 = ly_errno_location();
    *pLVar9 = LY_EINVAL;
    ly_log(LY_LLERR,"Internal module \"%s\" cannot be removed.",module->name);
  }
  return 1;
code_r0x001102ea:
  lVar6 = lVar13 + -0x10;
  lVar13 = lVar13 + 0x38;
  if ((*(byte *)(*(long *)(node->imp->rev + lVar6) + 0x40) & 0x40) != 0) goto LAB_001102fb;
  goto LAB_001102e1;
}

Assistant:

API int
lys_set_enabled(const struct lys_module *module)
{
    struct ly_ctx *ctx; /* shortcut */
    struct lys_module *mod;
    struct ly_set *mods, *disabled;
    int i;
    unsigned int u, v;

    if (!module) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    } else if (!module->disabled) {
        /* already enabled module */
        return EXIT_SUCCESS;
    }
    mod = (struct lys_module *)module;
    ctx = mod->ctx;

    /* avoid disabling internal modules */
    for (i = 0; i < INTERNAL_MODULES_COUNT; i++) {
        if (mod == ctx->models.list[i]) {
            LOGERR(LY_EINVAL, "Internal module \"%s\" cannot be removed.", mod->name);
            return EXIT_FAILURE;
        }
    }

    mods = ly_set_new();
    disabled = ly_set_new();

    /* enable the module, including its dependencies */
    lys_set_enabled_(mods, mod);

    /* we will go through the all disabled modules in the context, if the module has no dependency (import)
     * that is still disabled AND at least one of its imported module is from the set we are enabling now,
     * it is going to be also enabled. This way we try to revert everething that was possibly done by
     * lys_set_disabled(). */
checkdependency:
    for (i = INTERNAL_MODULES_COUNT; i < ctx->models.used; i++) {
        mod = ctx->models.list[i]; /* shortcut */
        if (!mod->disabled || ly_set_contains(disabled, mod) != -1) {
            /* skip the enabled modules */
            continue;
        }

        /* check imported modules */
        for (u = 0; u < mod->imp_size; u++) {
            if (mod->imp[u].module->disabled) {
                /* it has disabled dependency so it must stay disabled */
                break;
            }
        }
        if (u < mod->imp_size) {
            /* it has disabled dependency, continue with the next module in the context */
            continue;
        }

        /* get know if at least one of the imported modules is being enabled this time */
        for (u = 0; u < mod->imp_size; u++) {
            for (v = 0; v < mods->number; v++) {
                if (mod->imp[u].module == mods->set.g[v]) {
                    /* yes, it is, so they are connected and we are going to enable it as well,
                     * it is not necessary to call recursive lys_set_enable_() because we already
                     * know that there is no disabled import to enable */
                    mod->disabled = 0;
                    ly_set_add(mods, mod, 0);
                    /* we have to start again because some of the already checked modules can
                     * depend on the one we have just decided to enable */
                    goto checkdependency;
                }
            }
        }

        /* this module is disabled, but it does not depend on any other disabled module and none
         * of its imports was not enabled in this call. No future enabling of the disabled module
         * will change this so we can remember the module and skip it next time we will have to go
         * through the all context because of the checkdependency goto.
         */
        ly_set_add(disabled, mod, 0);
    }

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    ctx_modules_redo_backlinks(mods);

    /* re-apply the deviations and augments */
    for (v = 0; v < mods->number; v++) {
        lys_sub_module_apply_devs_augs((struct lys_module *)mods->set.g[v]);
    }

    /* free the sets */
    ly_set_free(mods);
    ly_set_free(disabled);

    /* update the module-set-id */
    ctx->models.module_set_id++;

    return EXIT_SUCCESS;
}